

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<false,_true,_false>::is_terminal_(DaTrie<false,_true,_false> *this,uint32_t node_pos)

{
  bool bVar1;
  uint32_t uVar2;
  const_reference pvVar3;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  undefined1 local_1;
  
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_leaf(pvVar3);
  if (bVar1) {
    if (in_ESI == 0) {
      local_1 = false;
    }
    else {
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
      uVar2 = Bc::check(pvVar3);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
      uVar2 = Bc::base(pvVar3);
      local_1 = uVar2 == in_ESI;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_terminal_(uint32_t node_pos) const {
    if (!bc_[node_pos].is_leaf()) {
      return false;
    }
    if (node_pos == ROOT_POS) {
      return false;
    }
    return (bc_[bc_[node_pos].check()].base() ^ node_pos) == 0;
  }